

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertPointersEqual
          (UtestShell *this,void *expected,void *actual,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  size_t lineNumber_00;
  size_t fileName_00;
  TestResult *pTVar1;
  SimpleString local_e0 [2];
  SimpleString local_c0;
  SimpleString local_b0;
  EqualsFailure local_a0;
  size_t local_38;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  void *actual_local;
  void *expected_local;
  UtestShell *this_local;
  
  local_38 = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = (char *)actual;
  actual_local = expected;
  expected_local = this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  fileName_00 = lineNumber_local;
  lineNumber_00 = local_38;
  if ((char *)actual_local != text_local) {
    ::StringFrom(&local_b0);
    ::StringFrom(&local_c0);
    SimpleString::SimpleString(local_e0,fileName_local);
    EqualsFailure::EqualsFailure
              (&local_a0,this,(char *)fileName_00,lineNumber_00,&local_b0,&local_c0,local_e0);
    (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
    EqualsFailure::~EqualsFailure(&local_a0);
    SimpleString::~SimpleString(local_e0);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_b0);
  }
  return;
}

Assistant:

void UtestShell::assertPointersEqual(const void* expected, const void* actual, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(EqualsFailure(this, fileName, lineNumber, StringFrom(expected), StringFrom(actual), text), testTerminator);
}